

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLsMassInitialize(void *arkode_mem)

{
  int iVar1;
  SUNLinearSolver_Type SVar2;
  SUNLinearSolver S;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLsMassInitialize",&ark_mem,&arkls_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  arkls_mem->nli = 0;
  arkls_mem->nps = 0;
  arkls_mem->nmvsetup = 0;
  arkls_mem->npe = 0;
  arkls_mem->nmtsetup = 0;
  arkls_mem->nmtimes = 0;
  arkls_mem->nmsetups = 0;
  arkls_mem->nmsolves = 0;
  arkls_mem->ncfl = 0;
  arkls_mem->msetuptime = -1.79769313486232e+308;
  if (arkls_mem->M == (SUNMatrix)0x0) {
    if ((arkls_mem->mtimes == (ARKLsMassTimesVecFn)0x0) &&
       (SVar2 = SUNLinSolGetType(arkls_mem->LS), SVar2 != SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
      msgfmt = "Missing user-provided mass matrix-vector product routine";
    }
    else {
LAB_004ada34:
      S = arkls_mem->LS;
      if (S != (SUNLinearSolver)0x0) {
        if ((((arkls_mem->M == (SUNMatrix)0x0) && (arkls_mem->pset == (ARKLsMassPrecSetupFn)0x0)) &&
            (arkls_mem->mtsetup == (ARKLsMassTimesSetupFn)0x0)) &&
           (ark_mem->step_disablemsetup != (ARKTimestepDisableMSetup)0x0)) {
          (*ark_mem->step_disablemsetup)(arkode_mem);
          S = arkls_mem->LS;
        }
        SVar2 = SUNLinSolGetType(S);
        if (SVar2 == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
          (*ark_mem->step_disablemsetup)(arkode_mem);
        }
        iVar1 = SUNLinSolInitialize(arkls_mem->LS);
        goto LAB_004adaf9;
      }
      msgfmt = "Missing SUNLinearSolver object";
    }
  }
  else if (arkls_mem->mass == (ARKLsMassFn)0x0) {
    msgfmt = "Missing user-provided mass-matrix routine";
  }
  else {
    if ((arkls_mem->mtimes != (ARKLsMassTimesVecFn)0x0) ||
       (arkls_mem->M->ops->matvec != (_func_int_SUNMatrix_N_Vector_N_Vector *)0x0))
    goto LAB_004ada34;
    msgfmt = "No available mass matrix-vector product routine";
  }
  iVar1 = -3;
  arkProcessError(ark_mem,-3,"ARKLS","arkLsMassInitialize",msgfmt);
LAB_004adaf9:
  arkls_mem->last_flag = iVar1;
  return iVar1;
}

Assistant:

int arkLsMassInitialize(void *arkode_mem)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLsMassInitialize",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* reset counters */
  arkLsInitializeMassCounters(arkls_mem);

  /* perform checks for matrix-based mass system */
  if (arkls_mem->M != NULL) {
    /* check for user-provided mass matrix constructor */
    if (arkls_mem->mass == NULL) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLsMassInitialize",
                      "Missing user-provided mass-matrix routine");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(arkls_mem->last_flag);
    }
    /* check that someone can perform matrix-vector product */
    if ((arkls_mem->mtimes == NULL) && (arkls_mem->M->ops->matvec == NULL)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLsMassInitialize",
                      "No available mass matrix-vector product routine");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(arkls_mem->last_flag);
    }
  }

  /* perform checks for matrix-free mass system */
  if ((arkls_mem->M == NULL) && (arkls_mem->mtimes == NULL) &&
      (SUNLinSolGetType(arkls_mem->LS) != SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsMassInitialize",
                    "Missing user-provided mass matrix-vector product routine");
    arkls_mem->last_flag = ARKLS_ILL_INPUT;
    return(arkls_mem->last_flag);
  }

  /* ensure that a mass matrix solver exists */
  if (arkls_mem->LS == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLsMassInitialize",
                    "Missing SUNLinearSolver object");
    arkls_mem->last_flag = ARKLS_ILL_INPUT;
    return(arkls_mem->last_flag);
  }

  /* if M is NULL and neither pset or mtsetup are present, then
     arkLsMassSetup does not need to be called, so set the
     msetup function to NULL */
  if ( (arkls_mem->M == NULL) &&
       (arkls_mem->pset == NULL) &&
       (arkls_mem->mtsetup == NULL) &&
       (ark_mem->step_disablemsetup != NULL) )
    ark_mem->step_disablemsetup(arkode_mem);

  /* When using a matrix-embedded linear solver, disable lsetup call */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
    ark_mem->step_disablemsetup(arkode_mem);

  /* Call LS initialize routine */
  arkls_mem->last_flag = SUNLinSolInitialize(arkls_mem->LS);
  return(arkls_mem->last_flag);
}